

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

sexp sexp_bignum_sqrt_estimate(sexp ctx,sexp a)

{
  sexp_uint_t sVar1;
  sexp in_RSI;
  long in_RDI;
  sexp unaff_retaddr;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp res;
  int i;
  int nbits;
  sexp_uint_t adata_hi;
  sexp_uint_t alen;
  undefined1 *local_40;
  sexp a_00;
  sexp psVar2;
  int local_28;
  
  sVar1 = sexp_bignum_hi(in_RSI);
  psVar2 = (sexp)&DAT_0000043e;
  memset(&local_40,0,0x10);
  local_28 = 0x3f;
  while ((0 < local_28 &&
         ((*(ulong *)((long)&in_RSI->value + sVar1 * 8 + 8) & 1L << ((byte)local_28 & 0x3f)) == 0)))
  {
    local_28 = local_28 + -1;
  }
  local_40 = &stack0xffffffffffffffd0;
  a_00 = *(sexp *)(in_RDI + 0x6080);
  *(undefined1 ***)(in_RDI + 0x6080) = &local_40;
  sexp_fixnum_to_bignum(psVar2,a_00);
  psVar2 = sexp_bignum_expt((sexp)__sexp_gc_preserver1.next,(sexp)__sexp_gc_preserver1.var,
                            unaff_retaddr);
  *(sexp *)(in_RDI + 0x6080) = a_00;
  return psVar2;
}

Assistant:

sexp sexp_bignum_sqrt_estimate (sexp ctx, sexp a) {
  sexp_uint_t alen=sexp_bignum_hi(a), adata_hi;
  int nbits, i;
  sexp_gc_var1(res);

  adata_hi = sexp_bignum_data(a)[alen - 1];
  for (i = sizeof(sexp_uint_t)*8-1; i > 0; i--)
    if (adata_hi & (1ul << i))
      break;
  nbits = sizeof(sexp_uint_t) * 8 * (alen - 1) + i + 1;

  sexp_gc_preserve1(ctx, res);
  res = sexp_fixnum_to_bignum(ctx, SEXP_TWO);
  res = sexp_bignum_expt(ctx, res, sexp_make_fixnum(nbits / 2));
  sexp_gc_release1(ctx);
  return res;
}